

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

bool ON_String::EqualOrdinal
               (char *string1,int element_count1,char *string2,int element_count2,
               bool bOrdinalIgnoreCase)

{
  ON__UINT32 OVar1;
  ON__UINT32 OVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  char null_terminator;
  char local_55;
  uint local_54;
  char *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  if (string1 == (char *)0x0 && element_count1 != 0) {
    return string2 == (char *)0x0;
  }
  if (string2 == (char *)0x0 && element_count2 != 0) {
    return string1 == (char *)0x0;
  }
  local_55 = '\0';
  if (element_count1 < 0) {
    element_count1 = Length(string1);
  }
  if (element_count2 < 0) {
    element_count2 = Length(string2);
  }
  if (element_count1 == 0) {
    string1 = &local_55;
  }
  if (element_count2 == 0) {
    string2 = &local_55;
  }
  bVar7 = true;
  if (element_count1 == element_count2 && string1 == string2) {
    return true;
  }
  uVar6 = element_count2;
  if (element_count1 < element_count2) {
    uVar6 = element_count1;
  }
  local_40 = (ulong)uVar6;
  local_54 = element_count2;
  if (bOrdinalIgnoreCase) {
    if (0 < (int)uVar6) {
      local_50 = string2 + local_40;
      local_48 = string1 + local_40;
      local_38 = (long)element_count1;
      if ((long)element_count2 < (long)element_count1) {
        local_38 = (long)element_count2;
      }
      lVar5 = 0;
      do {
        OVar1 = MapCodePointOrdinal((int)string1[lVar5],0x7f,
                                    MinimumOrdinal - ((int)string1[lVar5] - 0x41U < 0x3a));
        OVar2 = MapCodePointOrdinal((int)string2[lVar5],0x7f,
                                    MinimumOrdinal - ((int)string2[lVar5] - 0x41U < 0x3a));
        if (OVar1 != OVar2) {
          return false;
        }
        lVar5 = lVar5 + 1;
      } while ((int)local_38 != (int)lVar5);
      uVar6 = (uint)local_40;
      goto LAB_005ba523;
    }
  }
  else if (0 < (int)uVar6) {
    local_50 = string2 + local_40;
    local_48 = string1 + local_40;
    uVar4 = element_count1;
    if (element_count2 < element_count1) {
      uVar4 = element_count2;
    }
    lVar5 = 0;
    do {
      if (string1[lVar5] != string2[lVar5]) {
        return false;
      }
      lVar5 = lVar5 + 1;
    } while (uVar4 != (uint)lVar5);
    goto LAB_005ba523;
  }
  uVar6 = 0;
  local_50 = string2;
  local_48 = string1;
LAB_005ba523:
  uVar4 = uVar6;
  if ((int)uVar6 < element_count1) {
    lVar5 = 0;
    do {
      if (local_48[lVar5] != '\0') {
        return false;
      }
      lVar5 = lVar5 + 1;
      uVar4 = element_count1;
    } while (element_count1 - uVar6 != (int)lVar5);
  }
  if ((int)uVar4 < (int)local_54) {
    lVar5 = 0;
    do {
      bVar7 = local_50[lVar5] == '\0';
      if (!bVar7) {
        return bVar7;
      }
      iVar3 = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (~uVar4 + local_54 != iVar3);
  }
  return bVar7;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(string1,element_count1,string2,element_count2);

  const int element_count = (element_count1 <= element_count2) ? element_count1 : element_count2;
  int i;
  if (bOrdinalIgnoreCase)
  {
    unsigned int c1, c2;
    for(i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i = 0; i < element_count; i++)
    {
      if ((*string1++) != (*string2++))
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return false;
  }

  return true;
}